

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_object_iterator.c
# Opt level: O0

int main(int atgc,char **argv)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 local_38;
  json_object_iterator itEnd;
  json_object_iterator it;
  json_object *new_obj;
  char *input;
  char **argv_local;
  int atgc_local;
  
  itEnd.opaque_ = (void *)json_object_iter_init_default();
  uVar2 = json_tokener_parse(
                            "{\n\t\t\"string_of_digits\": \"123\",\n\t\t\"regular_number\": 222,\n\t\t\"decimal_number\": 99.55,\n\t\t\"boolean_true\": true,\n\t\t\"boolean_false\": false,\n\t\t\"big_number\": 2147483649,\n\t\t\"a_null\": null,\n\t\t}"
                            );
  itEnd.opaque_ = (void *)json_object_iter_begin(uVar2);
  local_38 = json_object_iter_end(uVar2);
  while( true ) {
    iVar1 = json_object_iter_equal(&itEnd,&local_38);
    if (iVar1 != 0) break;
    uVar3 = json_object_iter_peek_name(&itEnd);
    printf("%s\n",uVar3);
    uVar3 = json_object_iter_peek_value(&itEnd);
    uVar3 = json_object_to_json_string(uVar3);
    printf("%s\n",uVar3);
    json_object_iter_next(&itEnd);
  }
  json_object_put(uVar2);
  return 0;
}

Assistant:

int main(int atgc, char **argv)
{
	const char *input = "{\n\
		\"string_of_digits\": \"123\",\n\
		\"regular_number\": 222,\n\
		\"decimal_number\": 99.55,\n\
		\"boolean_true\": true,\n\
		\"boolean_false\": false,\n\
		\"big_number\": 2147483649,\n\
		\"a_null\": null,\n\
		}";

	struct json_object *new_obj;
	struct json_object_iterator it;
	struct json_object_iterator itEnd;

	it = json_object_iter_init_default();
	new_obj = json_tokener_parse(input);
	it = json_object_iter_begin(new_obj);
	itEnd = json_object_iter_end(new_obj);

	while (!json_object_iter_equal(&it, &itEnd))
	{
		printf("%s\n", json_object_iter_peek_name(&it));
		printf("%s\n", json_object_to_json_string(json_object_iter_peek_value(&it)));
		json_object_iter_next(&it);
	}

	json_object_put(new_obj);

	return 0;
}